

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode
               (ScriptContext *scriptContext,WasmReaderInfo *readerinfo,bool validateOnly)

{
  undefined1 local_190 [8];
  WasmBytecodeGenerator generator;
  bool validateOnly_local;
  WasmReaderInfo *readerinfo_local;
  ScriptContext *scriptContext_local;
  
  generator.m_evalStack.list._47_1_ = validateOnly;
  WasmBytecodeGenerator((WasmBytecodeGenerator *)local_190,scriptContext,readerinfo,validateOnly);
  GenerateFunction((WasmBytecodeGenerator *)local_190);
  ~WasmBytecodeGenerator((WasmBytecodeGenerator *)local_190);
  return;
}

Assistant:

void WasmBytecodeGenerator::GenerateFunctionBytecode(Js::ScriptContext* scriptContext, WasmReaderInfo* readerinfo, bool validateOnly /*= false*/)
{
    WasmBytecodeGenerator generator(scriptContext, readerinfo, validateOnly);
    generator.GenerateFunction();
}